

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::SetExternalData
          (Error *__return_storage_ptr__,Sign1Message *this,ByteArray *aExternalData)

{
  byte *pbExternalData;
  byte *pbVar1;
  char *pcVar2;
  _Bool _Var3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  format_args args;
  format_args args_00;
  writer write;
  string local_b8;
  writer local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pbExternalData =
       (aExternalData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pbVar1 = (aExternalData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pbExternalData == pbVar1) {
    local_68.types_[0] = none_type;
    pcVar5 = "cannot set COSE SIGN1 message to empty external data";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot set COSE SIGN1 message to empty external data";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x34;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_98.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar5 == "") break;
      pcVar4 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001dcf65:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar5,pcVar4);
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_68);
        bVar6 = true;
      }
      else {
        pcVar4 = pcVar5 + 1;
        bVar6 = pcVar4 != "";
        if (bVar6) {
          if (*pcVar4 != '{') {
            pcVar2 = pcVar5 + 2;
            do {
              pcVar4 = pcVar2;
              bVar6 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001dcf61;
              pcVar2 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar6 = true;
        }
LAB_001dcf61:
        if (bVar6) goto LAB_001dcf65;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar5,"");
        bVar6 = false;
      }
    } while (bVar6);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot set COSE SIGN1 message to empty external data",
               (string_view)ZEXT816(0x34),args_00);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  else {
    _Var3 = COSE_Sign0_SetExternal
                      (this->mSign,pbExternalData,(long)pbVar1 - (long)pbExternalData,
                       (cose_errback *)0x0);
    if (_Var3) {
      return __return_storage_ptr__;
    }
    local_68.types_[0] = none_type;
    pcVar5 = "set COSE SIGN1 message external data failed";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "set COSE SIGN1 message external data failed";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2b;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_98.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar5 == "") break;
      pcVar4 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001dce5e:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar5,pcVar4);
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_68);
        bVar6 = true;
      }
      else {
        pcVar4 = pcVar5 + 1;
        bVar6 = pcVar4 != "";
        if (bVar6) {
          if (*pcVar4 != '{') {
            pcVar2 = pcVar5 + 2;
            do {
              pcVar4 = pcVar2;
              bVar6 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001dce5a;
              pcVar2 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar6 = true;
        }
LAB_001dce5a:
        if (bVar6) goto LAB_001dce5e;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar5,"");
        bVar6 = false;
      }
    } while (bVar6);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"set COSE SIGN1 message external data failed",
               (string_view)ZEXT816(0x2b),args);
    local_90 = kUnknown;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  __return_storage_ptr__->mCode = local_90;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::SetExternalData(const ByteArray &aExternalData)
{
    Error error;

    VerifyOrExit(!aExternalData.empty(),
                 error = ERROR_INVALID_ARGS("cannot set COSE SIGN1 message to empty external data"));

    VerifyOrExit(COSE_Sign0_SetExternal(mSign, aExternalData.data(), aExternalData.size(), nullptr),
                 error = ERROR_UNKNOWN("set COSE SIGN1 message external data failed"));

exit:
    return error;
}